

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O1

int point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  uint64_t *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uchar b_y [32];
  uchar b_x [32];
  pt_aff_t_conflict P;
  uchar b_m [32];
  int8_t rnaf [52];
  pt_prj_t_conflict precomp [16];
  undefined1 local_868 [16];
  undefined1 local_838 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  uint8_t local_778 [32];
  uint8_t local_758 [32];
  undefined1 local_738 [48];
  undefined1 local_708 [16];
  byte local_6f8 [32];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  int8_t local_678 [51];
  char cStack_645;
  pt_prj_t_conflict local_638 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar12 = 0;
  if ((((pBVar6 != (BIGNUM *)0x0) &&
       (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar5,pBVar6,ctx), iVar12 = iVar4,
       iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar5,local_758,0x20), iVar4 == 0x20)) &&
     ((iVar4 = BN_bn2lebinpad(pBVar6,local_778,0x20), iVar4 == 0x20 &&
      (iVar4 = BN_bn2lebinpad(m,local_6f8,0x20), iVar4 == 0x20)))) {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_bytes((uint64_t *)local_738,local_758);
    puVar7 = (uint64_t *)(local_738 + 0x20);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_bytes(puVar7,local_778);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery
              ((uint64_t *)local_738,(uint64_t *)local_738);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery(puVar7,puVar7);
    local_678[0x20] = '\0';
    local_678[0x21] = '\0';
    local_678[0x22] = '\0';
    local_678[0x23] = '\0';
    local_678[0x24] = '\0';
    local_678[0x25] = '\0';
    local_678[0x26] = '\0';
    local_678[0x27] = '\0';
    local_678[0x28] = '\0';
    local_678[0x29] = '\0';
    local_678[0x2a] = '\0';
    local_678[0x2b] = '\0';
    local_678[0x2c] = '\0';
    local_678[0x2d] = '\0';
    local_678[0x2e] = '\0';
    local_678[0x2f] = '\0';
    local_678[0x10] = '\0';
    local_678[0x11] = '\0';
    local_678[0x12] = '\0';
    local_678[0x13] = '\0';
    local_678[0x14] = '\0';
    local_678[0x15] = '\0';
    local_678[0x16] = '\0';
    local_678[0x17] = '\0';
    local_678[0x18] = '\0';
    local_678[0x19] = '\0';
    local_678[0x1a] = '\0';
    local_678[0x1b] = '\0';
    local_678[0x1c] = '\0';
    local_678[0x1d] = '\0';
    local_678[0x1e] = '\0';
    local_678[0x1f] = '\0';
    local_678[0] = '\0';
    local_678[1] = '\0';
    local_678[2] = '\0';
    local_678[3] = '\0';
    local_678[4] = '\0';
    local_678[5] = '\0';
    local_678[6] = '\0';
    local_678[7] = '\0';
    local_678[8] = '\0';
    local_678[9] = '\0';
    local_678[10] = '\0';
    local_678[0xb] = '\0';
    local_678[0xc] = '\0';
    local_678[0xd] = '\0';
    local_678[0xe] = '\0';
    local_678[0xf] = '\0';
    stack0xfffffffffffff9b8 = 0;
    local_688 = ZEXT816(0);
    local_698 = ZEXT816(0);
    local_6a8 = ZEXT816(0);
    local_6b8 = ZEXT816(0);
    local_6c8 = ZEXT816(0);
    local_6d8 = ZEXT816(0);
    local_788 = ZEXT816(0);
    local_798 = ZEXT816(0);
    local_7a8 = ZEXT816(0);
    local_7b8 = ZEXT816(0);
    local_7c8 = ZEXT816(0);
    local_7d8 = ZEXT816(0);
    precomp_wnaf(local_638,(pt_aff_t_conflict *)local_738);
    scalar_rwnaf(local_678,local_6f8);
    puVar7 = local_638[0].Z + 2;
    lVar8 = 0;
    do {
      uVar13 = (ulong)((int)(cStack_645 + -1 >> 1 ^ (uint)lVar8) < 1);
      lVar10 = -uVar13;
      lVar9 = uVar13 - 1;
      auVar21._8_4_ = (int)lVar10;
      auVar21._0_8_ = lVar10;
      auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar22._8_4_ = (int)lVar9;
      auVar22._0_8_ = lVar9;
      auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
      local_6d8 = local_6d8 & auVar22 |
                  *(undefined1 (*) [16])((pt_prj_t_conflict *)(puVar7 + -10))->X & auVar21;
      local_6c8 = local_6c8 & auVar22 | *(undefined1 (*) [16])(puVar7 + -8) & auVar21;
      local_6b8 = local_6b8 & auVar22 | *(undefined1 (*) [16])(puVar7 + -6) & auVar21;
      local_6a8 = local_6a8 & auVar22 | *(undefined1 (*) [16])(puVar7 + -4) & auVar21;
      local_698 = local_698 & auVar22 | *(undefined1 (*) [16])(puVar7 + -2) & auVar21;
      local_688 = local_688 & auVar22 | auVar21 & *(undefined1 (*) [16])puVar7;
      lVar8 = lVar8 + 1;
      puVar7 = puVar7 + 0xc;
    } while (lVar8 != 0x10);
    local_7e8 = local_7d8;
    local_7f8 = local_7c8;
    local_838 = local_7b8;
    local_808 = local_798;
    local_818 = local_788;
    lVar8 = 0x32;
    local_868._0_8_ = local_7a8._0_8_;
    local_868._8_8_ = local_7a8._8_8_;
    do {
      iVar12 = 5;
      do {
        point_double((pt_prj_t_conflict *)local_6d8,(pt_prj_t_conflict *)local_6d8);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      cVar1 = local_678[lVar8];
      cVar2 = cVar1 >> 7;
      puVar7 = local_638[0].Z + 2;
      lVar9 = 0;
      do {
        uVar13 = (ulong)((int)((int)(char)(-1 - cVar2) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                              (uint)lVar9) < 1);
        lVar11 = -uVar13;
        lVar10 = uVar13 - 1;
        auVar15._8_4_ = (int)lVar11;
        auVar15._0_8_ = lVar11;
        auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar17._8_4_ = (int)lVar10;
        auVar17._0_8_ = lVar10;
        auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
        local_7e8 = local_7e8 & auVar17 |
                    *(undefined1 (*) [16])((pt_prj_t_conflict *)(puVar7 + -10))->X & auVar15;
        local_7f8 = local_7f8 & auVar17 | *(undefined1 (*) [16])(puVar7 + -8) & auVar15;
        local_838 = local_838 & auVar17 | *(undefined1 (*) [16])(puVar7 + -6) & auVar15;
        local_868 = local_868 & auVar17 | *(undefined1 (*) [16])(puVar7 + -4) & auVar15;
        local_808 = local_808 & auVar17 | *(undefined1 (*) [16])(puVar7 + -2) & auVar15;
        local_818 = local_818 & auVar17 | auVar15 & *(undefined1 (*) [16])puVar7;
        lVar9 = lVar9 + 1;
        puVar7 = puVar7 + 0xc;
      } while (lVar9 != 0x10);
      uVar13 = ~(long)cVar2;
      local_7d8 = local_7e8;
      local_7c8 = local_7f8;
      local_7b8 = local_838;
      local_7a8 = local_868;
      local_798 = local_808;
      local_788 = local_818;
      fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_opp
                ((uint64_t *)(local_738 + 0x20),(uint64_t *)local_7b8);
      auVar19._0_4_ = (uint)cVar2;
      auVar19._4_4_ = 0;
      auVar19._8_4_ = auVar19._0_4_;
      auVar19._12_4_ = 0;
      auVar20._8_4_ = (int)uVar13;
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = (int)(uVar13 >> 0x20);
      local_838 = local_838 & auVar20 | local_738._32_16_ & auVar19;
      auVar21 = auVar20 & local_868 | local_708 & auVar19;
      local_7b8 = local_838;
      local_7a8 = auVar21;
      point_add_proj((pt_prj_t_conflict *)local_6d8,(pt_prj_t_conflict *)local_6d8,
                     (pt_prj_t_conflict *)local_7d8);
      local_868._0_8_ = auVar21._0_8_;
      local_868._8_8_ = auVar21._8_8_;
      bVar14 = lVar8 != 0;
      lVar8 = lVar8 + -1;
    } while (bVar14);
    local_7c8._8_8_ = local_638[0].X[3];
    local_7c8._0_8_ = local_638[0].X[2];
    local_7d8._8_8_ = local_638[0].X[1];
    local_7d8._0_8_ = local_638[0].X[0];
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_opp((uint64_t *)local_7b8,local_638[0].Y);
    local_788._8_8_ = local_638[0].Z[3];
    local_788._0_8_ = local_638[0].Z[2];
    local_798._8_8_ = local_638[0].Z[1];
    local_798._0_8_ = local_638[0].Z[0];
    point_add_proj((pt_prj_t_conflict *)local_7d8,(pt_prj_t_conflict *)local_7d8,
                   (pt_prj_t_conflict *)local_6d8);
    lVar9 = -(ulong)(local_6f8[0] & 1);
    lVar8 = (ulong)(local_6f8[0] & 1) - 1;
    auVar16._8_4_ = (int)lVar9;
    auVar16._0_8_ = lVar9;
    auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar18._8_4_ = (int)lVar8;
    auVar18._0_8_ = lVar8;
    auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
    local_6d8 = local_7d8 & auVar18 | local_6d8 & auVar16;
    local_6c8 = local_7c8 & auVar18 | local_6c8 & auVar16;
    local_6b8 = local_7b8 & auVar18 | local_6b8 & auVar16;
    local_6a8 = local_7a8 & auVar18 | local_6a8 & auVar16;
    local_698 = local_798 & auVar18 | local_698 & auVar16;
    local_688 = auVar18 & local_788 | auVar16 & local_688;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv((uint64_t *)local_698,(uint64_t *)local_698);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
              ((uint64_t *)local_738,(uint64_t *)local_6d8,(uint64_t *)local_698);
    puVar7 = (uint64_t *)(local_738 + 0x20);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
              (puVar7,(uint64_t *)local_6b8,(uint64_t *)local_698);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_montgomery
              ((uint64_t *)local_738,(uint64_t *)local_738);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_montgomery(puVar7,puVar7);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_bytes(local_758,(uint64_t *)local_738);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_bytes(local_778,puVar7);
    iVar12 = CRYPTO_memcmp("",local_758,0x20);
    if ((iVar12 == 0) && (iVar12 = CRYPTO_memcmp("",local_778,0x20), iVar12 == 0)) {
      iVar12 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar12 == 0) {
        iVar12 = 0;
        goto LAB_0012ae24;
      }
    }
    else {
      lVar8 = BN_lebin2bn(local_758,0x20,pBVar5);
      iVar12 = 0;
      if ((lVar8 == 0) ||
         ((lVar8 = BN_lebin2bn(local_778,0x20,pBVar6), lVar8 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar4 == 0))))
      goto LAB_0012ae24;
    }
    iVar12 = 1;
  }
LAB_0012ae24:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar12;
}

Assistant:

int
    point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const EC_POINT *q,
                                                     const BIGNUM *m,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}